

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O0

pair<bool,_unsigned_long> __thiscall
LiteralTokenizerRule::tryMatch(LiteralTokenizerRule *this,shared_ptr<Readable> *reader)

{
  char cVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  element_type *peVar7;
  unsigned_long extraout_RAX;
  undefined8 uVar8;
  unsigned_long extraout_RAX_00;
  pair<bool,_unsigned_long> pVar10;
  unsigned_long local_60;
  bool local_51;
  int local_50;
  bool local_49;
  pair<bool,_int> local_48;
  int local_40;
  bool local_39;
  pair<bool,_int> local_38;
  ulong local_30;
  size_t i;
  shared_ptr<Readable> *reader_local;
  LiteralTokenizerRule *this_local;
  unsigned_long local_10;
  unsigned_long uVar9;
  
  i = (size_t)reader;
  reader_local = (shared_ptr<Readable> *)this;
  for (local_30 = 0; uVar2 = local_30, uVar5 = std::__cxx11::string::length(), uVar2 < uVar5;
      local_30 = local_30 + 1) {
    pcVar6 = (char *)std::__cxx11::string::at((ulong)&this->literal);
    cVar1 = *pcVar6;
    peVar7 = std::__shared_ptr_access<Readable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Readable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        reader);
    iVar4 = (*peVar7->_vptr_Readable[2])(peVar7,local_30);
    if (cVar1 != (char)iVar4) {
      local_39 = false;
      local_40 = 0;
      local_38 = std::make_pair<bool,int>(&local_39,&local_40);
      std::pair<bool,_unsigned_long>::pair<bool,_int,_true>
                ((pair<bool,_unsigned_long> *)&this_local,&local_38);
      uVar9 = extraout_RAX;
      goto LAB_00132c97;
    }
  }
  if ((this->nextCharMustBeNonAlpha & 1U) != 0) {
    peVar7 = std::__shared_ptr_access<Readable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Readable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        reader);
    uVar8 = std::__cxx11::string::size();
    iVar4 = (*peVar7->_vptr_Readable[2])(peVar7,uVar8);
    bVar3 = isLiteralRest((char)iVar4);
    if (bVar3) {
      local_49 = false;
      local_50 = 0;
      local_48 = std::make_pair<bool,int>(&local_49,&local_50);
      std::pair<bool,_unsigned_long>::pair<bool,_int,_true>
                ((pair<bool,_unsigned_long> *)&this_local,&local_48);
      uVar9 = extraout_RAX_00;
      goto LAB_00132c97;
    }
  }
  local_51 = true;
  local_60 = std::__cxx11::string::length();
  pVar10 = std::make_pair<bool,unsigned_long>(&local_51,&local_60);
  uVar9 = pVar10.second;
  this_local._0_1_ = pVar10.first;
  local_10 = uVar9;
LAB_00132c97:
  pVar10._1_7_ = (undefined7)(uVar9 >> 8);
  pVar10.first = (bool)this_local._0_1_;
  pVar10.second = local_10;
  return pVar10;
}

Assistant:

std::pair<bool, std::size_t> tryMatch(std::shared_ptr<Readable> reader) noexcept override {
    for (std::size_t i = 0; i < this->literal.length(); i++) {
      if (this->literal.at(i) != reader->charAt(i)) {
        return std::make_pair(false, 0);
      }
    }

    if (this->nextCharMustBeNonAlpha && isLiteralRest(reader->charAt(this->literal.size()))) {
      return std::make_pair(false, 0);
    }

    return std::make_pair(true, this->literal.length());
  }